

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

MultiplyBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_multiplybroadcastable(NeuralNetworkLayer *this)

{
  MultiplyBroadcastableLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 900) {
    clear_layer(this);
    this->_oneof_case_[0] = 900;
    this_00 = (MultiplyBroadcastableLayerParams *)operator_new(0x18);
    MultiplyBroadcastableLayerParams::MultiplyBroadcastableLayerParams(this_00);
    (this->layer_).multiplybroadcastable_ = this_00;
  }
  return (MultiplyBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MultiplyBroadcastableLayerParams* NeuralNetworkLayer::mutable_multiplybroadcastable() {
  if (!has_multiplybroadcastable()) {
    clear_layer();
    set_has_multiplybroadcastable();
    layer_.multiplybroadcastable_ = new ::CoreML::Specification::MultiplyBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.multiplyBroadcastable)
  return layer_.multiplybroadcastable_;
}